

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
solitaire::colliders::TableauPileCollider::tryGetCollidedCardIndex
          (TableauPileCollider *this,Position *position)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  uint local_28 [2];
  int cardIndex;
  Position *position_local;
  TableauPileCollider *this_local;
  
  _cardIndex = position;
  position_local = (Position *)this;
  bVar1 = isEmptyOrNotCollidesWithPileXPosition(this,position);
  if (bVar1) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
  }
  else {
    iVar2 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[7])();
    sVar3 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                      ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                       CONCAT44(extraout_var,iVar2));
    local_28[0] = (uint)sVar3;
    do {
      local_28[0] = local_28[0] - 1;
      if ((int)local_28[0] < 0) {
        std::optional<unsigned_int>::optional((optional<unsigned_int> *)&this_local);
        return (_Optional_base<unsigned_int,_true,_true>)
               (_Optional_base<unsigned_int,_true,_true>)this_local;
      }
      bVar1 = collidesWithCardYPosition(this,_cardIndex,local_28[0]);
    } while (!bVar1);
    std::optional<unsigned_int>::optional<int,_true>
              ((optional<unsigned_int> *)&this_local,(int *)local_28);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)this_local;
}

Assistant:

std::optional<unsigned>
TableauPileCollider::tryGetCollidedCardIndex(const Position& position) const {
    if (isEmptyOrNotCollidesWithPileXPosition(position))
        return std::nullopt;

    for (int cardIndex = tableauPile.getCards().size() - 1; cardIndex >= 0; --cardIndex)
        if (collidesWithCardYPosition(position, cardIndex))
            return cardIndex;

    return std::nullopt;
}